

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherLinux.cpp
# Opt level: O0

void __thiscall FW::FileWatcherLinux::update(FileWatcherLinux *this)

{
  mapped_type pWVar1;
  int iVar2;
  ssize_t sVar3;
  mapped_type *ppWVar4;
  WatchStruct *watch;
  inotify_event *pevent;
  char buff [4210688];
  ssize_t i;
  ssize_t len;
  int ret;
  FileWatcherLinux *this_local;
  
  iVar2 = this->mFD / 0x40;
  (this->mDescriptorSet).fds_bits[iVar2] =
       1L << ((byte)((long)this->mFD % 0x40) & 0x3f) | (this->mDescriptorSet).fds_bits[iVar2];
  iVar2 = select(this->mFD + 1,(fd_set *)&this->mDescriptorSet,(fd_set *)0x0,(fd_set *)0x0,
                 (timeval *)&this->mTimeOut);
  if (iVar2 < 0) {
    perror("select");
  }
  else if (((this->mDescriptorSet).fds_bits[this->mFD / 0x40] &
           1L << ((byte)((long)this->mFD % 0x40) & 0x3f)) != 0) {
    buff[0x403ff8] = '\0';
    buff[0x403ff9] = '\0';
    buff[0x403ffa] = '\0';
    buff[0x403ffb] = '\0';
    buff[0x403ffc] = '\0';
    buff[0x403ffd] = '\0';
    buff[0x403ffe] = '\0';
    buff[0x403fff] = '\0';
    memset(&pevent,0,0x404000);
    sVar3 = read(this->mFD,&pevent,0x404000);
    for (; (long)buff._4210680_8_ < sVar3;
        buff._4210680_8_ =
             (ulong)*(uint *)((long)&(watch->mDirName)._vptr_Path + 4) + 0x10 + buff._4210680_8_) {
      watch = (WatchStruct *)(buff + buff._4210680_8_ + -8);
      ppWVar4 = std::
                map<unsigned_long,_FW::WatchStruct_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_FW::WatchStruct_*>_>_>
                ::operator[](&this->mWatches,(key_type *)&stack0xffffffffffbfbfc0);
      pWVar1 = *ppWVar4;
      FileSystemUtils::Path::Path
                ((Path *)&stack0xffffffffffbfbf98,(char *)&(watch->mDirName).m_string);
      (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                (this,pWVar1,(Path *)&stack0xffffffffffbfbf98,
                 (ulong)*(uint *)((long)&watch->mWatchID + 4));
      FileSystemUtils::Path::~Path((Path *)&stack0xffffffffffbfbf98);
    }
  }
  return;
}

Assistant:

void FileWatcherLinux::update()
	{
		FD_SET(mFD, &mDescriptorSet);

		int ret = select(mFD + 1, &mDescriptorSet, NULL, NULL, &mTimeOut);
		if(ret < 0)
		{
			perror("select");
		}
		else if(FD_ISSET(mFD, &mDescriptorSet))
		{
			ssize_t len, i = 0;
			//char action[81+FILENAME_MAX] = {0};
			char buff[BUFF_SIZE] = {0};

			len = read (mFD, buff, BUFF_SIZE);
		   
			while (i < len)
			{
				struct inotify_event *pevent = (struct inotify_event *)&buff[i];

				WatchStruct* watch = mWatches[pevent->wd];
				handleAction(watch, pevent->name, pevent->mask);
				i += sizeof(struct inotify_event) + pevent->len;
			}
		}
	}